

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.h
# Opt level: O1

void __thiscall crnlib::dxt_hc::params::params(params *this)

{
  long lVar1;
  
  this->m_num_blocks = 0;
  this->m_num_levels = 0;
  lVar1 = 0;
  this->m_num_faces = 0;
  this->m_format = cDXT1;
  this->m_perceptual = true;
  this->m_hierarchical = true;
  this->m_color_endpoint_codebook_size = 0xc00;
  this->m_color_selector_codebook_size = 0xc00;
  this->m_alpha_endpoint_codebook_size = 0xc00;
  this->m_alpha_selector_codebook_size = 0xc00;
  this->m_adaptive_tile_color_psnr_derating = 2.0;
  this->m_adaptive_tile_alpha_psnr_derating = 2.0;
  this->m_adaptive_tile_color_alpha_weighting_ratio = 3.0;
  this->m_debugging = false;
  this->m_pProgress_func = (crn_progress_callback_func)0x0;
  this->m_pProgress_func_data = (void *)0x0;
  this->m_alpha_component_indices[0] = 3;
  this->m_alpha_component_indices[1] = 0;
  do {
    *(undefined8 *)((long)&this->m_levels[0].m_first_block + lVar1) = 0;
    *(undefined4 *)((long)&this->m_levels[0].m_block_width + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

params()
        : m_num_blocks(0),
          m_num_levels(0),
          m_num_faces(0),
          m_format(cDXT1),
          m_perceptual(true),
          m_hierarchical(true),
          m_color_endpoint_codebook_size(3072),
          m_color_selector_codebook_size(3072),
          m_alpha_endpoint_codebook_size(3072),
          m_alpha_selector_codebook_size(3072),
          m_adaptive_tile_color_psnr_derating(2.0f),
          m_adaptive_tile_alpha_psnr_derating(2.0f),
          m_adaptive_tile_color_alpha_weighting_ratio(3.0f),
          m_debugging(false),
          m_pProgress_func(0),
          m_pProgress_func_data(0) {
      m_alpha_component_indices[0] = 3;
      m_alpha_component_indices[1] = 0;
      for (uint i = 0; i < cCRNMaxLevels; i++) {
        m_levels[i].m_first_block = 0;
        m_levels[i].m_num_blocks = 0;
        m_levels[i].m_block_width = 0;
      }
    }